

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strerror.c
# Opt level: O0

char * curl_easy_strerror(CURLcode error)

{
  char *pcStack_10;
  CURLcode error_local;
  
  switch(error) {
  case CURLE_OK:
    pcStack_10 = "No error";
    break;
  case CURLE_UNSUPPORTED_PROTOCOL:
    pcStack_10 = "Unsupported protocol";
    break;
  case CURLE_FAILED_INIT:
    pcStack_10 = "Failed initialization";
    break;
  case CURLE_URL_MALFORMAT:
    pcStack_10 = "URL using bad/illegal format or missing URL";
    break;
  case CURLE_NOT_BUILT_IN:
    pcStack_10 = 
    "A requested feature, protocol or option was not found built-in in this libcurl due to a build-time decision."
    ;
    break;
  case CURLE_COULDNT_RESOLVE_PROXY:
    pcStack_10 = "Couldn\'t resolve proxy name";
    break;
  case CURLE_COULDNT_RESOLVE_HOST:
    pcStack_10 = "Couldn\'t resolve host name";
    break;
  case CURLE_COULDNT_CONNECT:
    pcStack_10 = "Couldn\'t connect to server";
    break;
  case CURLE_WEIRD_SERVER_REPLY:
    pcStack_10 = "Weird server reply";
    break;
  case CURLE_REMOTE_ACCESS_DENIED:
    pcStack_10 = "Access denied to remote resource";
    break;
  case CURLE_FTP_ACCEPT_FAILED:
    pcStack_10 = "FTP: The server failed to connect to data port";
    break;
  case CURLE_FTP_WEIRD_PASS_REPLY:
    pcStack_10 = "FTP: unknown PASS reply";
    break;
  case CURLE_FTP_ACCEPT_TIMEOUT:
    pcStack_10 = "FTP: Accepting server connect has timed out";
    break;
  case CURLE_FTP_WEIRD_PASV_REPLY:
    pcStack_10 = "FTP: unknown PASV reply";
    break;
  case CURLE_FTP_WEIRD_227_FORMAT:
    pcStack_10 = "FTP: unknown 227 response format";
    break;
  case CURLE_FTP_CANT_GET_HOST:
    pcStack_10 = "FTP: can\'t figure out the host in the PASV response";
    break;
  case CURLE_HTTP2:
    pcStack_10 = "Error in the HTTP2 framing layer";
    break;
  case CURLE_FTP_COULDNT_SET_TYPE:
    pcStack_10 = "FTP: couldn\'t set file type";
    break;
  case CURLE_PARTIAL_FILE:
    pcStack_10 = "Transferred a partial file";
    break;
  case CURLE_FTP_COULDNT_RETR_FILE:
    pcStack_10 = "FTP: couldn\'t retrieve (RETR failed) the specified file";
    break;
  case CURLE_OBSOLETE20:
  case CURLE_OBSOLETE24:
  case CURLE_OBSOLETE29:
  case CURLE_OBSOLETE32:
  case CURLE_OBSOLETE40:
  case CURLE_OBSOLETE44:
  case CURLE_OBSOLETE46:
  case CURLE_OBSOLETE50:
  case CURLE_OBSOLETE57:
  case CURL_LAST:
  default:
    pcStack_10 = "Unknown error";
    break;
  case CURLE_QUOTE_ERROR:
    pcStack_10 = "Quote command returned error";
    break;
  case CURLE_HTTP_RETURNED_ERROR:
    pcStack_10 = "HTTP response code said error";
    break;
  case CURLE_WRITE_ERROR:
    pcStack_10 = "Failed writing received data to disk/application";
    break;
  case CURLE_UPLOAD_FAILED:
    pcStack_10 = "Upload failed (at start/before it took off)";
    break;
  case CURLE_READ_ERROR:
    pcStack_10 = "Failed to open/read local data from file/application";
    break;
  case CURLE_OUT_OF_MEMORY:
    pcStack_10 = "Out of memory";
    break;
  case CURLE_OPERATION_TIMEDOUT:
    pcStack_10 = "Timeout was reached";
    break;
  case CURLE_FTP_PORT_FAILED:
    pcStack_10 = "FTP: command PORT failed";
    break;
  case CURLE_FTP_COULDNT_USE_REST:
    pcStack_10 = "FTP: command REST failed";
    break;
  case CURLE_RANGE_ERROR:
    pcStack_10 = "Requested range was not delivered by the server";
    break;
  case CURLE_HTTP_POST_ERROR:
    pcStack_10 = "Internal problem setting up the POST";
    break;
  case CURLE_SSL_CONNECT_ERROR:
    pcStack_10 = "SSL connect error";
    break;
  case CURLE_BAD_DOWNLOAD_RESUME:
    pcStack_10 = "Couldn\'t resume download";
    break;
  case CURLE_FILE_COULDNT_READ_FILE:
    pcStack_10 = "Couldn\'t read a file:// file";
    break;
  case CURLE_LDAP_CANNOT_BIND:
    pcStack_10 = "LDAP: cannot bind";
    break;
  case CURLE_LDAP_SEARCH_FAILED:
    pcStack_10 = "LDAP: search failed";
    break;
  case CURLE_FUNCTION_NOT_FOUND:
    pcStack_10 = "A required function in the library was not found";
    break;
  case CURLE_ABORTED_BY_CALLBACK:
    pcStack_10 = "Operation was aborted by an application callback";
    break;
  case CURLE_BAD_FUNCTION_ARGUMENT:
    pcStack_10 = "A libcurl function was given a bad argument";
    break;
  case CURLE_INTERFACE_FAILED:
    pcStack_10 = "Failed binding local connection end";
    break;
  case CURLE_TOO_MANY_REDIRECTS:
    pcStack_10 = "Number of redirects hit maximum amount";
    break;
  case CURLE_UNKNOWN_OPTION:
    pcStack_10 = "An unknown option was passed in to libcurl";
    break;
  case CURLE_TELNET_OPTION_SYNTAX:
    pcStack_10 = "Malformed telnet option";
    break;
  case CURLE_PEER_FAILED_VERIFICATION:
    pcStack_10 = "SSL peer certificate or SSH remote key was not OK";
    break;
  case CURLE_GOT_NOTHING:
    pcStack_10 = "Server returned nothing (no headers, no data)";
    break;
  case CURLE_SSL_ENGINE_NOTFOUND:
    pcStack_10 = "SSL crypto engine not found";
    break;
  case CURLE_SSL_ENGINE_SETFAILED:
    pcStack_10 = "Can not set SSL crypto engine as default";
    break;
  case CURLE_SEND_ERROR:
    pcStack_10 = "Failed sending data to the peer";
    break;
  case CURLE_RECV_ERROR:
    pcStack_10 = "Failure when receiving data from the peer";
    break;
  case CURLE_SSL_CERTPROBLEM:
    pcStack_10 = "Problem with the local SSL certificate";
    break;
  case CURLE_SSL_CIPHER:
    pcStack_10 = "Couldn\'t use specified SSL cipher";
    break;
  case CURLE_SSL_CACERT:
    pcStack_10 = "Peer certificate cannot be authenticated with given CA certificates";
    break;
  case CURLE_BAD_CONTENT_ENCODING:
    pcStack_10 = "Unrecognized or bad HTTP Content or Transfer-Encoding";
    break;
  case CURLE_LDAP_INVALID_URL:
    pcStack_10 = "Invalid LDAP URL";
    break;
  case CURLE_FILESIZE_EXCEEDED:
    pcStack_10 = "Maximum file size exceeded";
    break;
  case CURLE_USE_SSL_FAILED:
    pcStack_10 = "Requested SSL level failed";
    break;
  case CURLE_SEND_FAIL_REWIND:
    pcStack_10 = "Send failed since rewinding of the data stream failed";
    break;
  case CURLE_SSL_ENGINE_INITFAILED:
    pcStack_10 = "Failed to initialise SSL crypto engine";
    break;
  case CURLE_LOGIN_DENIED:
    pcStack_10 = "Login denied";
    break;
  case CURLE_TFTP_NOTFOUND:
    pcStack_10 = "TFTP: File Not Found";
    break;
  case CURLE_TFTP_PERM:
    pcStack_10 = "TFTP: Access Violation";
    break;
  case CURLE_REMOTE_DISK_FULL:
    pcStack_10 = "Disk full or allocation exceeded";
    break;
  case CURLE_TFTP_ILLEGAL:
    pcStack_10 = "TFTP: Illegal operation";
    break;
  case CURLE_TFTP_UNKNOWNID:
    pcStack_10 = "TFTP: Unknown transfer ID";
    break;
  case CURLE_REMOTE_FILE_EXISTS:
    pcStack_10 = "Remote file already exists";
    break;
  case CURLE_TFTP_NOSUCHUSER:
    pcStack_10 = "TFTP: No such user";
    break;
  case CURLE_CONV_FAILED:
    pcStack_10 = "Conversion failed";
    break;
  case CURLE_CONV_REQD:
    pcStack_10 = "Caller must register CURLOPT_CONV_ callback options";
    break;
  case CURLE_SSL_CACERT_BADFILE:
    pcStack_10 = "Problem with the SSL CA cert (path? access rights?)";
    break;
  case CURLE_REMOTE_FILE_NOT_FOUND:
    pcStack_10 = "Remote file not found";
    break;
  case CURLE_SSH:
    pcStack_10 = "Error in the SSH layer";
    break;
  case CURLE_SSL_SHUTDOWN_FAILED:
    pcStack_10 = "Failed to shut down the SSL connection";
    break;
  case CURLE_AGAIN:
    pcStack_10 = "Socket not ready for send/recv";
    break;
  case CURLE_SSL_CRL_BADFILE:
    pcStack_10 = "Failed to load CRL file (path? access rights?, format?)";
    break;
  case CURLE_SSL_ISSUER_ERROR:
    pcStack_10 = "Issuer check against peer certificate failed";
    break;
  case CURLE_FTP_PRET_FAILED:
    pcStack_10 = "FTP: The server did not accept the PRET command.";
    break;
  case CURLE_RTSP_CSEQ_ERROR:
    pcStack_10 = "RTSP CSeq mismatch or invalid CSeq";
    break;
  case CURLE_RTSP_SESSION_ERROR:
    pcStack_10 = "RTSP session error";
    break;
  case CURLE_FTP_BAD_FILE_LIST:
    pcStack_10 = "Unable to parse FTP file list";
    break;
  case CURLE_CHUNK_FAILED:
    pcStack_10 = "Chunk callback failed";
    break;
  case CURLE_NO_CONNECTION_AVAILABLE:
    pcStack_10 = "The max connection limit is reached";
    break;
  case CURLE_SSL_PINNEDPUBKEYNOTMATCH:
    pcStack_10 = "SSL public key does not match pinned public key";
    break;
  case CURLE_SSL_INVALIDCERTSTATUS:
    pcStack_10 = "SSL server certificate status verification FAILED";
    break;
  case CURLE_HTTP2_STREAM:
    pcStack_10 = "Stream error in the HTTP/2 framing layer";
  }
  return pcStack_10;
}

Assistant:

const char *
curl_easy_strerror(CURLcode error)
{
#ifndef CURL_DISABLE_VERBOSE_STRINGS
  switch(error) {
  case CURLE_OK:
    return "No error";

  case CURLE_UNSUPPORTED_PROTOCOL:
    return "Unsupported protocol";

  case CURLE_FAILED_INIT:
    return "Failed initialization";

  case CURLE_URL_MALFORMAT:
    return "URL using bad/illegal format or missing URL";

  case CURLE_NOT_BUILT_IN:
    return "A requested feature, protocol or option was not found built-in in"
      " this libcurl due to a build-time decision.";

  case CURLE_COULDNT_RESOLVE_PROXY:
    return "Couldn't resolve proxy name";

  case CURLE_COULDNT_RESOLVE_HOST:
    return "Couldn't resolve host name";

  case CURLE_COULDNT_CONNECT:
    return "Couldn't connect to server";

  case CURLE_WEIRD_SERVER_REPLY:
    return "Weird server reply";

  case CURLE_REMOTE_ACCESS_DENIED:
    return "Access denied to remote resource";

  case CURLE_FTP_ACCEPT_FAILED:
    return "FTP: The server failed to connect to data port";

  case CURLE_FTP_ACCEPT_TIMEOUT:
    return "FTP: Accepting server connect has timed out";

  case CURLE_FTP_PRET_FAILED:
    return "FTP: The server did not accept the PRET command.";

  case CURLE_FTP_WEIRD_PASS_REPLY:
    return "FTP: unknown PASS reply";

  case CURLE_FTP_WEIRD_PASV_REPLY:
    return "FTP: unknown PASV reply";

  case CURLE_FTP_WEIRD_227_FORMAT:
    return "FTP: unknown 227 response format";

  case CURLE_FTP_CANT_GET_HOST:
    return "FTP: can't figure out the host in the PASV response";

  case CURLE_HTTP2:
    return "Error in the HTTP2 framing layer";

  case CURLE_FTP_COULDNT_SET_TYPE:
    return "FTP: couldn't set file type";

  case CURLE_PARTIAL_FILE:
    return "Transferred a partial file";

  case CURLE_FTP_COULDNT_RETR_FILE:
    return "FTP: couldn't retrieve (RETR failed) the specified file";

  case CURLE_QUOTE_ERROR:
    return "Quote command returned error";

  case CURLE_HTTP_RETURNED_ERROR:
    return "HTTP response code said error";

  case CURLE_WRITE_ERROR:
    return "Failed writing received data to disk/application";

  case CURLE_UPLOAD_FAILED:
    return "Upload failed (at start/before it took off)";

  case CURLE_READ_ERROR:
    return "Failed to open/read local data from file/application";

  case CURLE_OUT_OF_MEMORY:
    return "Out of memory";

  case CURLE_OPERATION_TIMEDOUT:
    return "Timeout was reached";

  case CURLE_FTP_PORT_FAILED:
    return "FTP: command PORT failed";

  case CURLE_FTP_COULDNT_USE_REST:
    return "FTP: command REST failed";

  case CURLE_RANGE_ERROR:
    return "Requested range was not delivered by the server";

  case CURLE_HTTP_POST_ERROR:
    return "Internal problem setting up the POST";

  case CURLE_SSL_CONNECT_ERROR:
    return "SSL connect error";

  case CURLE_BAD_DOWNLOAD_RESUME:
    return "Couldn't resume download";

  case CURLE_FILE_COULDNT_READ_FILE:
    return "Couldn't read a file:// file";

  case CURLE_LDAP_CANNOT_BIND:
    return "LDAP: cannot bind";

  case CURLE_LDAP_SEARCH_FAILED:
    return "LDAP: search failed";

  case CURLE_FUNCTION_NOT_FOUND:
    return "A required function in the library was not found";

  case CURLE_ABORTED_BY_CALLBACK:
    return "Operation was aborted by an application callback";

  case CURLE_BAD_FUNCTION_ARGUMENT:
    return "A libcurl function was given a bad argument";

  case CURLE_INTERFACE_FAILED:
    return "Failed binding local connection end";

  case CURLE_TOO_MANY_REDIRECTS :
    return "Number of redirects hit maximum amount";

  case CURLE_UNKNOWN_OPTION:
    return "An unknown option was passed in to libcurl";

  case CURLE_TELNET_OPTION_SYNTAX :
    return "Malformed telnet option";

  case CURLE_PEER_FAILED_VERIFICATION:
    return "SSL peer certificate or SSH remote key was not OK";

  case CURLE_GOT_NOTHING:
    return "Server returned nothing (no headers, no data)";

  case CURLE_SSL_ENGINE_NOTFOUND:
    return "SSL crypto engine not found";

  case CURLE_SSL_ENGINE_SETFAILED:
    return "Can not set SSL crypto engine as default";

  case CURLE_SSL_ENGINE_INITFAILED:
    return "Failed to initialise SSL crypto engine";

  case CURLE_SEND_ERROR:
    return "Failed sending data to the peer";

  case CURLE_RECV_ERROR:
    return "Failure when receiving data from the peer";

  case CURLE_SSL_CERTPROBLEM:
    return "Problem with the local SSL certificate";

  case CURLE_SSL_CIPHER:
    return "Couldn't use specified SSL cipher";

  case CURLE_SSL_CACERT:
    return "Peer certificate cannot be authenticated with given CA "
      "certificates";

  case CURLE_SSL_CACERT_BADFILE:
    return "Problem with the SSL CA cert (path? access rights?)";

  case CURLE_BAD_CONTENT_ENCODING:
    return "Unrecognized or bad HTTP Content or Transfer-Encoding";

  case CURLE_LDAP_INVALID_URL:
    return "Invalid LDAP URL";

  case CURLE_FILESIZE_EXCEEDED:
    return "Maximum file size exceeded";

  case CURLE_USE_SSL_FAILED:
    return "Requested SSL level failed";

  case CURLE_SSL_SHUTDOWN_FAILED:
    return "Failed to shut down the SSL connection";

  case CURLE_SSL_CRL_BADFILE:
    return "Failed to load CRL file (path? access rights?, format?)";

  case CURLE_SSL_ISSUER_ERROR:
    return "Issuer check against peer certificate failed";

  case CURLE_SEND_FAIL_REWIND:
    return "Send failed since rewinding of the data stream failed";

  case CURLE_LOGIN_DENIED:
    return "Login denied";

  case CURLE_TFTP_NOTFOUND:
    return "TFTP: File Not Found";

  case CURLE_TFTP_PERM:
    return "TFTP: Access Violation";

  case CURLE_REMOTE_DISK_FULL:
    return "Disk full or allocation exceeded";

  case CURLE_TFTP_ILLEGAL:
    return "TFTP: Illegal operation";

  case CURLE_TFTP_UNKNOWNID:
    return "TFTP: Unknown transfer ID";

  case CURLE_REMOTE_FILE_EXISTS:
    return "Remote file already exists";

  case CURLE_TFTP_NOSUCHUSER:
    return "TFTP: No such user";

  case CURLE_CONV_FAILED:
    return "Conversion failed";

  case CURLE_CONV_REQD:
    return "Caller must register CURLOPT_CONV_ callback options";

  case CURLE_REMOTE_FILE_NOT_FOUND:
    return "Remote file not found";

  case CURLE_SSH:
    return "Error in the SSH layer";

  case CURLE_AGAIN:
    return "Socket not ready for send/recv";

  case CURLE_RTSP_CSEQ_ERROR:
    return "RTSP CSeq mismatch or invalid CSeq";

  case CURLE_RTSP_SESSION_ERROR:
    return "RTSP session error";

  case CURLE_FTP_BAD_FILE_LIST:
    return "Unable to parse FTP file list";

  case CURLE_CHUNK_FAILED:
    return "Chunk callback failed";

  case CURLE_NO_CONNECTION_AVAILABLE:
    return "The max connection limit is reached";

  case CURLE_SSL_PINNEDPUBKEYNOTMATCH:
    return "SSL public key does not match pinned public key";

  case CURLE_SSL_INVALIDCERTSTATUS:
    return "SSL server certificate status verification FAILED";

  case CURLE_HTTP2_STREAM:
    return "Stream error in the HTTP/2 framing layer";

    /* error codes not used by current libcurl */
  case CURLE_OBSOLETE20:
  case CURLE_OBSOLETE24:
  case CURLE_OBSOLETE29:
  case CURLE_OBSOLETE32:
  case CURLE_OBSOLETE40:
  case CURLE_OBSOLETE44:
  case CURLE_OBSOLETE46:
  case CURLE_OBSOLETE50:
  case CURLE_OBSOLETE57:
  case CURL_LAST:
    break;
  }
  /*
   * By using a switch, gcc -Wall will complain about enum values
   * which do not appear, helping keep this function up-to-date.
   * By using gcc -Wall -Werror, you can't forget.
   *
   * A table would not have the same benefit.  Most compilers will
   * generate code very similar to a table in any case, so there
   * is little performance gain from a table.  And something is broken
   * for the user's application, anyways, so does it matter how fast
   * it _doesn't_ work?
   *
   * The line number for the error will be near this comment, which
   * is why it is here, and not at the start of the switch.
   */
  return "Unknown error";
#else
  if(!error)
    return "No error";
  else
    return "Error";
#endif
}